

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O0

void __thiscall Controller::HandleInput(Controller *this,bool *running,Snake *snake)

{
  int iVar1;
  int local_58 [2];
  SDL_Event e;
  Snake *snake_local;
  bool *running_local;
  Controller *this_local;
  
  e._48_8_ = snake;
  snake_local = (Snake *)running;
  running_local = (bool *)this;
  while (iVar1 = SDL_PollEvent(local_58), iVar1 != 0) {
    if (local_58[0] == 0x100) {
      *(undefined1 *)&snake_local->direction = kUp;
    }
    else if (local_58[0] == 0x300) {
      if (e.motion.which == this->_Up) {
        ChangeDirection(this,(Snake *)e._48_8_,kUp,kDown);
      }
      else if (e.motion.which == this->_Down) {
        ChangeDirection(this,(Snake *)e._48_8_,kDown,kUp);
      }
      else if (e.motion.which == this->_Left) {
        ChangeDirection(this,(Snake *)e._48_8_,kLeft,kRight);
      }
      else {
        ChangeDirection(this,(Snake *)e._48_8_,kRight,kLeft);
      }
    }
  }
  return;
}

Assistant:

void Controller::HandleInput(bool &running, Snake &snake) const {
  SDL_Event e;
  while (SDL_PollEvent(&e)) {
    if (e.type == SDL_QUIT) {
      running = false;
    } else if (e.type == SDL_KEYDOWN) {
      
      if(e.key.keysym.sym == _Up)
          ChangeDirection(snake, Snake::Direction::kUp,Snake::Direction::kDown);
      else if(e.key.keysym.sym == _Down)
          ChangeDirection(snake, Snake::Direction::kDown,Snake::Direction::kUp);
      else if(e.key.keysym.sym == _Left)
          ChangeDirection(snake, Snake::Direction::kLeft,Snake::Direction::kRight);
      else
          ChangeDirection(snake, Snake::Direction::kRight, Snake::Direction::kLeft);
    }
  }
}